

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseInlineImport(WastParser *this,Import *import)

{
  Result RVar1;
  Enum EVar2;
  
  RVar1 = Expect(this,Lpar);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = Expect(this,Import);
    if (RVar1.enum_ != Error) {
      EVar2 = Error;
      RVar1 = ParseQuotedText(this,&import->module_name,true);
      if (RVar1.enum_ != Error) {
        EVar2 = Error;
        RVar1 = ParseQuotedText(this,&import->field_name,true);
        if (RVar1.enum_ != Error) {
          RVar1 = Expect(this,Rpar);
          EVar2 = (Enum)(RVar1.enum_ == Error);
        }
      }
    }
  }
  return (Result)EVar2;
}

Assistant:

Result WastParser::ParseInlineImport(Import* import) {
  WABT_TRACE(ParseInlineImport);
  EXPECT(Lpar);
  EXPECT(Import);
  CHECK_RESULT(ParseQuotedText(&import->module_name));
  CHECK_RESULT(ParseQuotedText(&import->field_name));
  EXPECT(Rpar);
  return Result::Ok;
}